

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O0

void __thiscall rengine::StandardSurface::onRender(StandardSurface *this)

{
  bool bVar1;
  int iVar2;
  Renderer *__p;
  pointer pRVar3;
  undefined4 extraout_var;
  pointer this_00;
  Node *pNVar4;
  undefined4 extraout_var_00;
  StandardSurface *this_local;
  
  bVar1 = Surface::beginRender(&this->super_Surface);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_renderer);
    if (!bVar1) {
      __p = Surface::createRenderer(&this->super_Surface);
      std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::reset
                (&this->m_renderer,__p);
      pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
               operator->(&this->m_renderer);
      iVar2 = (*(this->super_Surface)._vptr_Surface[4])();
      Renderer::setSceneRoot(pRVar3,(Node *)CONCAT44(extraout_var,iVar2));
    }
    pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::operator->
                       (&this->m_renderer);
    this_00 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
              operator->(&this->m_renderer);
    pNVar4 = Renderer::sceneRoot(this_00);
    iVar2 = (*(this->super_Surface)._vptr_Surface[5])(this,pNVar4);
    Renderer::setSceneRoot(pRVar3,(Node *)CONCAT44(extraout_var_00,iVar2));
    pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::operator->
                       (&this->m_renderer);
    pNVar4 = Renderer::sceneRoot(pRVar3);
    if (pNVar4 != (Node *)0x0) {
      AnimationManager::tick(&this->m_animationManager);
      (*(this->super_Surface)._vptr_Surface[6])();
      pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
               operator->(&this->m_renderer);
      (*pRVar3->_vptr_Renderer[4])();
      (*(this->super_Surface)._vptr_Surface[7])();
      Surface::commitRender(&this->super_Surface);
      pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
               operator->(&this->m_renderer);
      (*pRVar3->_vptr_Renderer[6])();
      bVar1 = AnimationManager::animationsRunning(&this->m_animationManager);
      if ((bVar1) ||
         (bVar1 = AnimationManager::animationsScheduled(&this->m_animationManager), bVar1)) {
        Surface::requestRender(&this->super_Surface);
      }
    }
  }
  return;
}

Assistant:

void onRender() override {
        if (!beginRender())
            return;

        // Initialize the renderer if this is the first time around
        if (!m_renderer) {
            m_renderer.reset(createRenderer());
            m_renderer->setSceneRoot(build());
        }

        // Update the scene graph...
        m_renderer->setSceneRoot(update(m_renderer->sceneRoot()));

        if (!m_renderer->sceneRoot())
            return;

        // Advance the animations just before rendering..
        m_animationManager.tick();

        // And then render the stuff
        onBeforeRender();
        m_renderer->render();
        onAfterRender();

        commitRender();
        m_renderer->frameSwapped();

        // Schedule a repaint again if there are animations running...

        // ### TODO: Optimize waiting for scheduled animations. Rather than
        // just keep on rendering, we should figure out how long we need to
        // wait and schedule an update at that time.
        if (m_animationManager.animationsRunning() || m_animationManager.animationsScheduled()) {
            requestRender();
        }
    }